

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadCustom::LoadIntLoadResidual_F(ChLoadCustom *this,ChVectorDynamic<> *R,double c)

{
  Scalar SVar1;
  undefined1 auVar2 [16];
  element_type *peVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Scalar *pSVar7;
  ulong uVar8;
  int i;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  uVar9 = 0;
  uVar6 = 0;
  while( true ) {
    iVar4 = (*((this->loadable).super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_ChLoadable[8])();
    if (iVar4 <= (int)uVar9) break;
    peVar3 = (this->loadable).super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar4 = (*peVar3->_vptr_ChLoadable[0xb])(peVar3,(ulong)uVar9);
    if ((char)iVar4 != '\0') {
      peVar3 = (this->loadable).super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar4 = (*peVar3->_vptr_ChLoadable[9])(peVar3,(ulong)uVar9);
      uVar8 = 0;
      while( true ) {
        peVar3 = (this->loadable).super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        uVar5 = (*peVar3->_vptr_ChLoadable[10])(peVar3,(ulong)uVar9);
        if (uVar5 <= uVar8) break;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            &this->load_Q,uVar6 + uVar8 & 0xffffffff);
        SVar1 = *pSVar7;
        pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)R,
                            (ulong)(uint)(iVar4 + (int)uVar8));
        auVar10._8_8_ = 0;
        auVar10._0_8_ = c;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = SVar1;
        uVar8 = uVar8 + 1;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *pSVar7;
        auVar2 = vfmadd213sd_fma(auVar11,auVar10,auVar2);
        *pSVar7 = auVar2._0_8_;
      }
      uVar6 = uVar6 + (int)uVar8;
    }
    uVar9 = uVar9 + 1;
  }
  return;
}

Assistant:

void ChLoadCustom::LoadIntLoadResidual_F(ChVectorDynamic<>& R, const double c) {
    unsigned int rowQ = 0;
    for (int i = 0; i < loadable->GetSubBlocks(); ++i) {
        if (loadable->IsSubBlockActive(i)) {
            unsigned int moffset = loadable->GetSubBlockOffset(i);
            for (unsigned int row = 0; row < loadable->GetSubBlockSize(i); ++row) {
                R(row + moffset) += load_Q(rowQ) * c;
                ++rowQ;
            }
        }
    }
}